

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<const_QObject_*,_QList<QCss::StyleRule>_> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>>::
findNode<QObject_const*>
          (Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *this,QObject **key)

{
  long lVar1;
  bool bVar2;
  Node<const_QObject_*,_QList<QCss::StyleRule>_> *pNVar3;
  QObject **in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QObject_const*>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_>::Bucket::isUnused
                    ((Bucket *)0x47d3cb);
  if (bVar2) {
    pNVar3 = (Node<const_QObject_*,_QList<QCss::StyleRule>_> *)0x0;
  }
  else {
    pNVar3 = Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_>::Bucket::node
                       ((Bucket *)0x47d3e6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }